

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

int Sfm_DecCombineDec(Sfm_Dec_t *p,word *pTruth0,word *pTruth1,int *pSupp0,int *pSupp1,int nSupp0,
                     int nSupp1,word *pTruth,int *pSupp,int Var)

{
  word *pCtrl;
  int iVar1;
  int iVar2;
  int iSuppVar;
  int nSupp;
  int nWords0;
  Vec_Int_t vVec;
  Vec_Int_t vVec1;
  Vec_Int_t vVec0;
  int nSupp0_local;
  int *pSupp1_local;
  int *pSupp0_local;
  word *pTruth1_local;
  word *pTruth0_local;
  Sfm_Dec_t *p_local;
  
  vVec1.pArray._0_4_ = 0x10;
  vVec.pArray._0_4_ = 0x10;
  vVec.pArray._4_4_ = nSupp1;
  nSupp = 0x10;
  nWords0 = 0;
  vVec._0_8_ = pSupp;
  vVec1._0_8_ = pSupp1;
  vVec1.pArray._4_4_ = nSupp0;
  iVar1 = Abc_TtWordNum(nSupp0);
  if (((nSupp0 == nSupp1) && (iVar2 = memcmp(pSupp0,pSupp1,(long)nSupp0 << 2), iVar2 == 0)) &&
     (iVar2 = memcmp(pTruth0,pTruth1,(long)iVar1 << 3), iVar2 == 0)) {
    memcpy(pSupp,pSupp0,(long)nSupp0 << 2);
    memcpy(pTruth,pTruth0,(long)iVar1 << 3);
    Abc_TtStretch6(pTruth,nSupp0,p->pPars->nVarMax);
    return nSupp0;
  }
  Vec_IntTwoMerge2Int((Vec_Int_t *)&vVec1.pArray,(Vec_Int_t *)&vVec.pArray,(Vec_Int_t *)&nSupp);
  Vec_IntPushOrder((Vec_Int_t *)&nSupp,Var);
  p_local._4_4_ = Vec_IntSize((Vec_Int_t *)&nSupp);
  if (p->pPars->nVarMax < p_local._4_4_) {
    p_local._4_4_ = -2;
  }
  else {
    Abc_TtStretch6(pTruth0,nSupp0,p_local._4_4_);
    Abc_TtStretch6(pTruth1,nSupp1,p_local._4_4_);
    Abc_TtExpand(pTruth0,p_local._4_4_,pSupp0,nSupp0,pSupp,p_local._4_4_);
    Abc_TtExpand(pTruth1,p_local._4_4_,pSupp1,nSupp1,pSupp,p_local._4_4_);
    iVar1 = Vec_IntFind((Vec_Int_t *)&nSupp,Var);
    pCtrl = p->pTtElems[iVar1];
    iVar1 = Abc_TtWordNum(p_local._4_4_);
    Abc_TtMux(pTruth,pCtrl,pTruth1,pTruth0,iVar1);
    Abc_TtStretch6(pTruth,p_local._4_4_,p->pPars->nVarMax);
  }
  return p_local._4_4_;
}

Assistant:

int Sfm_DecCombineDec( Sfm_Dec_t * p, word * pTruth0, word * pTruth1, int * pSupp0, int * pSupp1, int nSupp0, int nSupp1, word * pTruth, int * pSupp, int Var )
{
    Vec_Int_t vVec0 = { 2*SFM_SUPP_MAX, nSupp0, pSupp0 };
    Vec_Int_t vVec1 = { 2*SFM_SUPP_MAX, nSupp1, pSupp1 };
    Vec_Int_t vVec  = { 2*SFM_SUPP_MAX, 0,      pSupp  };
    int nWords0 = Abc_TtWordNum(nSupp0);
    int nSupp, iSuppVar;
    // check the case of equal cofactors
    if ( nSupp0 == nSupp1 && !memcmp(pSupp0, pSupp1, sizeof(int)*nSupp0) && !memcmp(pTruth0, pTruth1, sizeof(word)*nWords0) )
    {
        memcpy( pSupp,  pSupp0,  sizeof(int)*nSupp0   );
        memcpy( pTruth, pTruth0, sizeof(word)*nWords0 );
        Abc_TtStretch6( pTruth, nSupp0, p->pPars->nVarMax );
        return nSupp0;
    }
    // merge support variables
    Vec_IntTwoMerge2Int( &vVec0, &vVec1, &vVec );
    Vec_IntPushOrder( &vVec, Var );
    nSupp = Vec_IntSize( &vVec );
    if ( nSupp > p->pPars->nVarMax )
        return -2;
    // expand truth tables
    Abc_TtStretch6( pTruth0, nSupp0, nSupp );
    Abc_TtStretch6( pTruth1, nSupp1, nSupp );
    Abc_TtExpand( pTruth0, nSupp, pSupp0, nSupp0, pSupp, nSupp );
    Abc_TtExpand( pTruth1, nSupp, pSupp1, nSupp1, pSupp, nSupp );
    // perform operation
    iSuppVar = Vec_IntFind( &vVec, Var );
    Abc_TtMux( pTruth, p->pTtElems[iSuppVar], pTruth1, pTruth0, Abc_TtWordNum(nSupp) );
    Abc_TtStretch6( pTruth, nSupp, p->pPars->nVarMax );
    return nSupp;
}